

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::RmsPropTrainer::update(RmsPropTrainer *this,real scale)

{
  real rVar1;
  Model *pMVar2;
  pointer ppLVar3;
  long lVar4;
  Parameters *this_00;
  pointer pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  LookupParameters *this_01;
  pointer pTVar9;
  pointer pTVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  byte bVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  undefined4 extraout_var;
  Index size;
  pointer ppPVar22;
  pointer ppLVar23;
  _Hash_node_base *p_Var24;
  ulong uVar25;
  Index index_2;
  ulong uVar26;
  Index index_1;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  RmsPropTrainer *pRVar30;
  uint uVar31;
  ushort uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  int iVar53;
  Scalar SVar54;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  scalar_sum_op<float,_float> local_c9;
  RmsPropTrainer *local_c8;
  ulong local_c0;
  float local_b4;
  pointer local_b0;
  _Hash_node_base *local_a8;
  pointer local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  pointer local_78;
  float *local_70;
  ulong local_68;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  local_50;
  
  local_b0 = (pointer)CONCAT44(local_b0._4_4_,scale);
  local_c8 = this;
  if (this->shadow_params_allocated == false) {
    pMVar2 = (this->super_Trainer).model;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->hg,
               (long)(pMVar2->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pMVar2->params).
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    pMVar2 = (this->super_Trainer).model;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->hlg,
             (long)(pMVar2->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar2->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
    pMVar2 = (this->super_Trainer).model;
    ppLVar23 = (pMVar2->lookup_params).
               super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppLVar3 = (pMVar2->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppLVar23 != ppLVar3) {
      uVar26 = 0;
      do {
        lVar4 = *(long *)&this->hlg;
        iVar20 = (*((*ppLVar23)->super_ParametersBase)._vptr_ParametersBase[3])();
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)(uVar26 * 0x18 + lVar4),
                   CONCAT44(extraout_var,iVar20));
        ppLVar23 = ppLVar23 + 1;
        uVar26 = (ulong)((int)uVar26 + 1);
      } while (ppLVar23 != ppLVar3);
    }
    local_c8->shadow_params_allocated = true;
  }
  local_b4 = Trainer::clip_gradients(&local_c8->super_Trainer);
  pMVar2 = (local_c8->super_Trainer).model;
  ppPVar22 = (pMVar2->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = (pMVar2->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppPVar22 != local_a0) {
    local_c0 = CONCAT44(local_c0._4_4_,local_b4 * local_b0._0_4_);
    local_a8 = (_Hash_node_base *)0x0;
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      local_88._0_8_ = ppPVar22;
      this_00 = *ppPVar22;
      uVar26 = (ulong)(this_00->values).d.nd;
      iVar20 = 1;
      iVar53 = 1;
      if (uVar26 != 0) {
        auVar37 = vpbroadcastq_avx512f();
        uVar25 = 0;
        auVar38 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar14 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar18 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar19 = (byte)uVar14;
          uVar32 = CONCAT11(bVar19,bVar18);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar25));
          auVar40._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
          auVar40._0_4_ = (uint)(bVar18 & 1) * auVar38._0_4_;
          auVar40._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
          auVar40._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
          auVar40._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
          auVar40._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
          auVar40._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
          auVar40._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
          auVar40._32_4_ = (uint)(bVar19 & 1) * auVar38._32_4_;
          auVar40._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar38._36_4_;
          auVar40._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar38._40_4_;
          auVar40._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar38._44_4_;
          auVar40._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar38._48_4_;
          auVar40._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar38._52_4_;
          auVar40._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar38._56_4_;
          auVar40._60_4_ = (uint)(bVar19 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar40,auVar39);
          uVar25 = uVar25 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar25);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar38._0_4_ =
             (uint)(bVar18 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar39._0_4_;
        bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar11 * auVar37._4_4_ | (uint)!bVar11 * auVar39._4_4_;
        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar11 * auVar37._8_4_ | (uint)!bVar11 * auVar39._8_4_;
        bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar11 * auVar37._12_4_ | (uint)!bVar11 * auVar39._12_4_;
        bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar38._16_4_ = (uint)bVar11 * auVar37._16_4_ | (uint)!bVar11 * auVar39._16_4_;
        bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar38._20_4_ = (uint)bVar11 * auVar37._20_4_ | (uint)!bVar11 * auVar39._20_4_;
        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar38._24_4_ = (uint)bVar11 * auVar37._24_4_ | (uint)!bVar11 * auVar39._24_4_;
        bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar38._28_4_ = (uint)bVar11 * auVar37._28_4_ | (uint)!bVar11 * auVar39._28_4_;
        auVar38._32_4_ =
             (uint)(bVar19 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar39._32_4_;
        bVar11 = (bool)(bVar19 >> 1 & 1);
        auVar38._36_4_ = (uint)bVar11 * auVar37._36_4_ | (uint)!bVar11 * auVar39._36_4_;
        bVar11 = (bool)(bVar19 >> 2 & 1);
        auVar38._40_4_ = (uint)bVar11 * auVar37._40_4_ | (uint)!bVar11 * auVar39._40_4_;
        bVar11 = (bool)(bVar19 >> 3 & 1);
        auVar38._44_4_ = (uint)bVar11 * auVar37._44_4_ | (uint)!bVar11 * auVar39._44_4_;
        bVar11 = (bool)(bVar19 >> 4 & 1);
        auVar38._48_4_ = (uint)bVar11 * auVar37._48_4_ | (uint)!bVar11 * auVar39._48_4_;
        bVar11 = (bool)(bVar19 >> 5 & 1);
        auVar38._52_4_ = (uint)bVar11 * auVar37._52_4_ | (uint)!bVar11 * auVar39._52_4_;
        bVar11 = (bool)(bVar19 >> 6 & 1);
        auVar38._56_4_ = (uint)bVar11 * auVar37._56_4_ | (uint)!bVar11 * auVar39._56_4_;
        auVar38._60_4_ =
             (uint)(bVar19 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar39._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar38,1);
        auVar37 = vpmulld_avx512f(auVar38,ZEXT3264(auVar34));
        auVar64 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar33 = vpshufd_avx(auVar64,0xee);
        auVar64 = vpmulld_avx(auVar64,auVar33);
        auVar33 = vpshufd_avx(auVar64,0x55);
        auVar64 = vpmulld_avx(auVar64,auVar33);
        iVar53 = auVar64._0_4_;
      }
      uVar26 = (ulong)(this_00->g).d.nd;
      if (uVar26 != 0) {
        auVar37 = vpbroadcastq_avx512f();
        uVar25 = 0;
        auVar38 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar14 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar18 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar19 = (byte)uVar14;
          uVar32 = CONCAT11(bVar19,bVar18);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar25));
          auVar45._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
          auVar45._0_4_ = (uint)(bVar18 & 1) * auVar38._0_4_;
          auVar45._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
          auVar45._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
          auVar45._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
          auVar45._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
          auVar45._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
          auVar45._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
          auVar45._32_4_ = (uint)(bVar19 & 1) * auVar38._32_4_;
          auVar45._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar38._36_4_;
          auVar45._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar38._40_4_;
          auVar45._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar38._44_4_;
          auVar45._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar38._48_4_;
          auVar45._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar38._52_4_;
          auVar45._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar38._56_4_;
          auVar45._60_4_ = (uint)(bVar19 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar45,auVar39);
          uVar25 = uVar25 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar25);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar41._0_4_ =
             (uint)(bVar18 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar39._0_4_;
        bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar11 * auVar37._4_4_ | (uint)!bVar11 * auVar39._4_4_;
        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar11 * auVar37._8_4_ | (uint)!bVar11 * auVar39._8_4_;
        bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar11 * auVar37._12_4_ | (uint)!bVar11 * auVar39._12_4_;
        bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar41._16_4_ = (uint)bVar11 * auVar37._16_4_ | (uint)!bVar11 * auVar39._16_4_;
        bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar41._20_4_ = (uint)bVar11 * auVar37._20_4_ | (uint)!bVar11 * auVar39._20_4_;
        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar41._24_4_ = (uint)bVar11 * auVar37._24_4_ | (uint)!bVar11 * auVar39._24_4_;
        bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar41._28_4_ = (uint)bVar11 * auVar37._28_4_ | (uint)!bVar11 * auVar39._28_4_;
        auVar41._32_4_ =
             (uint)(bVar19 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar39._32_4_;
        bVar11 = (bool)(bVar19 >> 1 & 1);
        auVar41._36_4_ = (uint)bVar11 * auVar37._36_4_ | (uint)!bVar11 * auVar39._36_4_;
        bVar11 = (bool)(bVar19 >> 2 & 1);
        auVar41._40_4_ = (uint)bVar11 * auVar37._40_4_ | (uint)!bVar11 * auVar39._40_4_;
        bVar11 = (bool)(bVar19 >> 3 & 1);
        auVar41._44_4_ = (uint)bVar11 * auVar37._44_4_ | (uint)!bVar11 * auVar39._44_4_;
        bVar11 = (bool)(bVar19 >> 4 & 1);
        auVar41._48_4_ = (uint)bVar11 * auVar37._48_4_ | (uint)!bVar11 * auVar39._48_4_;
        bVar11 = (bool)(bVar19 >> 5 & 1);
        auVar41._52_4_ = (uint)bVar11 * auVar37._52_4_ | (uint)!bVar11 * auVar39._52_4_;
        bVar11 = (bool)(bVar19 >> 6 & 1);
        auVar41._56_4_ = (uint)bVar11 * auVar37._56_4_ | (uint)!bVar11 * auVar39._56_4_;
        auVar41._60_4_ =
             (uint)(bVar19 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar39._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar41,1);
        auVar37 = vpmulld_avx512f(auVar41,ZEXT3264(auVar34));
        auVar64 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar33 = vpshufd_avx(auVar64,0xee);
        auVar64 = vpmulld_avx(auVar64,auVar33);
        auVar33 = vpshufd_avx(auVar64,0x55);
        auVar64 = vpmulld_avx(auVar64,auVar33);
        iVar20 = auVar64._0_4_;
      }
      pfVar5 = (local_c8->hg).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar6 = (this_00->values).v;
      uVar31 = iVar53 * (this_00->values).d.bd;
      rVar1 = (local_c8->super_Trainer).lambda;
      auVar64 = ZEXT416((uint)rVar1);
      local_70 = (this_00->g).v;
      uVar21 = iVar20 * (this_00->g).d.bd;
      local_68 = (ulong)uVar21;
      if (uVar21 == 0) {
        auVar33 = ZEXT816(0) << 0x40;
      }
      else {
        local_98 = ZEXT416((uint)rVar1);
        local_50.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
        .m_d.argImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = local_70;
        local_50.
        super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
        .
        super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
        .m_d.argImpl.
        super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
        .
        super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value = local_68;
        SVar54 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                           (&local_50,&local_c9,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                             *)&local_70);
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar33._0_8_ = (double)SVar54;
        auVar33._8_8_ = extraout_XMM0_Qb;
        auVar64 = local_98;
      }
      auVar60._0_8_ = (double)(local_c8->rho * pfVar5[(ulong)local_a8 & 0xffffffff]);
      auVar60._8_8_ = 0;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = 1.0 - (double)local_c8->rho;
      auVar33 = vfmadd213sd_fma(auVar56,auVar33,auVar60);
      pfVar5[(ulong)local_a8 & 0xffffffff] = (float)auVar33._0_8_;
      fVar12 = (float)auVar33._0_8_ + local_c8->epsilon;
      auVar33 = vrsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
      auVar56 = vfmadd213ss_fma(ZEXT416((uint)(fVar12 * auVar33._0_4_)),auVar33,ZEXT416(0xc0400000))
      ;
      pfVar7 = (this_00->g).v;
      uVar26 = (ulong)(this_00->g).d.nd;
      if (uVar26 == 0) {
        iVar20 = 1;
      }
      else {
        auVar37 = vpbroadcastq_avx512f();
        uVar25 = 0;
        auVar38 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar14 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar18 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar19 = (byte)uVar14;
          uVar32 = CONCAT11(bVar19,bVar18);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar25));
          auVar42._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
          auVar42._0_4_ = (uint)(bVar18 & 1) * auVar38._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
          auVar42._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
          auVar42._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
          auVar42._32_4_ = (uint)(bVar19 & 1) * auVar38._32_4_;
          auVar42._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar38._36_4_;
          auVar42._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar38._40_4_;
          auVar42._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar38._44_4_;
          auVar42._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar38._48_4_;
          auVar42._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar38._52_4_;
          auVar42._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar38._56_4_;
          auVar42._60_4_ = (uint)(bVar19 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar42,auVar39);
          uVar25 = uVar25 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar25);
        auVar37 = vmovdqa32_avx512f(auVar38);
        auVar43._0_4_ =
             (uint)(bVar18 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar39._0_4_;
        bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar11 * auVar37._4_4_ | (uint)!bVar11 * auVar39._4_4_;
        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar11 * auVar37._8_4_ | (uint)!bVar11 * auVar39._8_4_;
        bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar11 * auVar37._12_4_ | (uint)!bVar11 * auVar39._12_4_;
        bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar43._16_4_ = (uint)bVar11 * auVar37._16_4_ | (uint)!bVar11 * auVar39._16_4_;
        bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar43._20_4_ = (uint)bVar11 * auVar37._20_4_ | (uint)!bVar11 * auVar39._20_4_;
        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar43._24_4_ = (uint)bVar11 * auVar37._24_4_ | (uint)!bVar11 * auVar39._24_4_;
        bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar43._28_4_ = (uint)bVar11 * auVar37._28_4_ | (uint)!bVar11 * auVar39._28_4_;
        auVar43._32_4_ =
             (uint)(bVar19 & 1) * auVar37._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar39._32_4_;
        bVar11 = (bool)(bVar19 >> 1 & 1);
        auVar43._36_4_ = (uint)bVar11 * auVar37._36_4_ | (uint)!bVar11 * auVar39._36_4_;
        bVar11 = (bool)(bVar19 >> 2 & 1);
        auVar43._40_4_ = (uint)bVar11 * auVar37._40_4_ | (uint)!bVar11 * auVar39._40_4_;
        bVar11 = (bool)(bVar19 >> 3 & 1);
        auVar43._44_4_ = (uint)bVar11 * auVar37._44_4_ | (uint)!bVar11 * auVar39._44_4_;
        bVar11 = (bool)(bVar19 >> 4 & 1);
        auVar43._48_4_ = (uint)bVar11 * auVar37._48_4_ | (uint)!bVar11 * auVar39._48_4_;
        bVar11 = (bool)(bVar19 >> 5 & 1);
        auVar43._52_4_ = (uint)bVar11 * auVar37._52_4_ | (uint)!bVar11 * auVar39._52_4_;
        bVar11 = (bool)(bVar19 >> 6 & 1);
        auVar43._56_4_ = (uint)bVar11 * auVar37._56_4_ | (uint)!bVar11 * auVar39._56_4_;
        auVar43._60_4_ =
             (uint)(bVar19 >> 7) * auVar37._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar39._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar43,1);
        auVar37 = vpmulld_avx512f(auVar43,ZEXT3264(auVar34));
        auVar60 = vpmulld_avx(auVar37._0_16_,auVar37._16_16_);
        auVar13 = vpshufd_avx(auVar60,0xee);
        auVar60 = vpmulld_avx(auVar60,auVar13);
        auVar13 = vpshufd_avx(auVar60,0x55);
        auVar60 = vpmulld_avx(auVar60,auVar13);
        iVar20 = auVar60._0_4_;
      }
      if (iVar20 * (this_00->g).d.bd != uVar31) {
LAB_0022dd1f:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>]"
                     );
      }
      uVar26 = (ulong)(this_00->values).d.nd;
      if (uVar26 == 0) {
        iVar20 = 1;
      }
      else {
        auVar37 = vpbroadcastq_avx512f();
        uVar25 = 0;
        auVar38 = vpbroadcastd_avx512f(ZEXT416(1));
        do {
          auVar39 = vmovdqa64_avx512f(auVar38);
          auVar38 = vpbroadcastq_avx512f();
          auVar40 = vporq_avx512f(auVar38,auVar35);
          auVar38 = vporq_avx512f(auVar38,auVar36);
          uVar14 = vpcmpuq_avx512f(auVar38,auVar37,2);
          bVar18 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar40,auVar37,2);
          bVar19 = (byte)uVar14;
          uVar32 = CONCAT11(bVar19,bVar18);
          auVar38 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar25));
          auVar44._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar38._4_4_;
          auVar44._0_4_ = (uint)(bVar18 & 1) * auVar38._0_4_;
          auVar44._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar38._8_4_;
          auVar44._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar38._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar38._16_4_;
          auVar44._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar38._20_4_;
          auVar44._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar38._24_4_;
          auVar44._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar38._28_4_;
          auVar44._32_4_ = (uint)(bVar19 & 1) * auVar38._32_4_;
          auVar44._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar38._36_4_;
          auVar44._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar38._40_4_;
          auVar44._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar38._44_4_;
          auVar44._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar38._48_4_;
          auVar44._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar38._52_4_;
          auVar44._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar38._56_4_;
          auVar44._60_4_ = (uint)(bVar19 >> 7) * auVar38._60_4_;
          auVar38 = vpmulld_avx512f(auVar44,auVar39);
          uVar25 = uVar25 + 0x10;
        } while ((uVar26 + 0xf & 0x1fffffff0) != uVar25);
        auVar36 = vmovdqa32_avx512f(auVar38);
        auVar35._0_4_ =
             (uint)(bVar18 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar39._0_4_;
        bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar11 * auVar36._4_4_ | (uint)!bVar11 * auVar39._4_4_;
        bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar11 * auVar36._8_4_ | (uint)!bVar11 * auVar39._8_4_;
        bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar11 * auVar36._12_4_ | (uint)!bVar11 * auVar39._12_4_;
        bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar11 * auVar36._16_4_ | (uint)!bVar11 * auVar39._16_4_;
        bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar11 * auVar36._20_4_ | (uint)!bVar11 * auVar39._20_4_;
        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar11 * auVar36._24_4_ | (uint)!bVar11 * auVar39._24_4_;
        bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
        auVar35._28_4_ = (uint)bVar11 * auVar36._28_4_ | (uint)!bVar11 * auVar39._28_4_;
        auVar35._32_4_ =
             (uint)(bVar19 & 1) * auVar36._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar39._32_4_;
        bVar11 = (bool)(bVar19 >> 1 & 1);
        auVar35._36_4_ = (uint)bVar11 * auVar36._36_4_ | (uint)!bVar11 * auVar39._36_4_;
        bVar11 = (bool)(bVar19 >> 2 & 1);
        auVar35._40_4_ = (uint)bVar11 * auVar36._40_4_ | (uint)!bVar11 * auVar39._40_4_;
        bVar11 = (bool)(bVar19 >> 3 & 1);
        auVar35._44_4_ = (uint)bVar11 * auVar36._44_4_ | (uint)!bVar11 * auVar39._44_4_;
        bVar11 = (bool)(bVar19 >> 4 & 1);
        auVar35._48_4_ = (uint)bVar11 * auVar36._48_4_ | (uint)!bVar11 * auVar39._48_4_;
        bVar11 = (bool)(bVar19 >> 5 & 1);
        auVar35._52_4_ = (uint)bVar11 * auVar36._52_4_ | (uint)!bVar11 * auVar39._52_4_;
        bVar11 = (bool)(bVar19 >> 6 & 1);
        auVar35._56_4_ = (uint)bVar11 * auVar36._56_4_ | (uint)!bVar11 * auVar39._56_4_;
        auVar35._60_4_ =
             (uint)(bVar19 >> 7) * auVar36._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar39._60_4_;
        auVar34 = vextracti64x4_avx512f(auVar35,1);
        auVar36 = vpmulld_avx512f(auVar35,ZEXT3264(auVar34));
        auVar60 = vpmulld_avx(auVar36._0_16_,auVar36._16_16_);
        auVar13 = vpshufd_avx(auVar60,0xee);
        auVar60 = vpmulld_avx(auVar60,auVar13);
        auVar13 = vpshufd_avx(auVar60,0x55);
        auVar60 = vpmulld_avx(auVar60,auVar13);
        iVar20 = auVar60._0_4_;
      }
      uVar21 = iVar20 * (this_00->values).d.bd;
      uVar26 = (ulong)uVar21;
      if (uVar21 != uVar31) {
LAB_0022dcfd:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::sub_assign_op<float, float>]"
                     );
      }
      pfVar8 = (this_00->values).v;
      uVar25 = uVar26;
      if ((((ulong)pfVar8 & 3) == 0) &&
         (uVar25 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 0xf), uVar26 <= uVar25)) {
        uVar25 = uVar26;
      }
      fVar12 = (float)local_c0 * (local_c8->super_Trainer).eta * auVar33._0_4_ * -0.5 *
               auVar56._0_4_;
      uVar28 = uVar26 - uVar25;
      uVar27 = uVar28 + 0xf;
      if (-1 < (long)uVar28) {
        uVar27 = uVar28;
      }
      if (uVar25 != 0) {
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar33 = vxorps_avx512vl(ZEXT416((uint)fVar12),auVar13);
        uVar29 = 0;
        do {
          auVar56 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * pfVar6[uVar29])),auVar33,
                                    ZEXT416((uint)pfVar7[uVar29]));
          pfVar8[uVar29] = auVar56._0_4_ + pfVar8[uVar29];
          uVar29 = uVar29 + 1;
        } while (uVar25 != uVar29);
      }
      uVar27 = (uVar27 & 0xfffffffffffffff0) + uVar25;
      if (0xf < (long)uVar28) {
        auVar57._0_4_ = -fVar12;
        auVar57._4_4_ = 0x80000000;
        auVar57._8_4_ = 0x80000000;
        auVar57._12_4_ = 0x80000000;
        auVar36 = vbroadcastss_avx512f(auVar57);
        auVar61._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
        auVar61._8_4_ = auVar64._8_4_ ^ 0x80000000;
        auVar61._12_4_ = auVar64._12_4_ ^ 0x80000000;
        auVar35 = vbroadcastss_avx512f(auVar61);
        do {
          auVar37 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar25),auVar36,
                                        *(undefined1 (*) [64])(pfVar8 + uVar25));
          auVar37 = vfmadd231ps_avx512f(auVar37,auVar35,*(undefined1 (*) [64])(pfVar6 + uVar25));
          *(undefined1 (*) [64])(pfVar8 + uVar25) = auVar37;
          uVar25 = uVar25 + 0x10;
        } while ((long)uVar25 < (long)uVar27);
      }
      if ((long)uVar27 < (long)uVar26) {
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar33 = vxorps_avx512vl(ZEXT416((uint)fVar12),auVar15);
        do {
          auVar56 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * pfVar6[uVar27])),auVar33,
                                    ZEXT416((uint)pfVar7[uVar27]));
          pfVar8[uVar27] = auVar56._0_4_ + pfVar8[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar26 != uVar27);
      }
      local_a8 = (_Hash_node_base *)(ulong)((int)local_a8 + 1);
      Parameters::clear(this_00);
      ppPVar22 = (pointer)(local_88._0_8_ + 8);
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (ppPVar22 != local_a0);
  }
  pMVar2 = (local_c8->super_Trainer).model;
  ppLVar23 = (pMVar2->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_78 = (pMVar2->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar23 != local_78) {
    local_a0 = (pointer)CONCAT44(local_a0._4_4_,local_b4 * local_b0._0_4_);
    local_c0 = 0;
    auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_01 = *ppLVar23;
      p_Var24 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      local_b0 = ppLVar23;
      if (p_Var24 != (_Hash_node_base *)0x0) {
        local_98._0_8_ = (local_c0 & 0xffffffff) * 0x18 + *(long *)&local_c8->hlg;
        pRVar30 = local_c8;
        do {
          uVar26 = (ulong)*(uint *)&p_Var24[1]._M_nxt;
          pTVar9 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar25 = (ulong)pTVar9[uVar26].d.nd;
          iVar20 = 1;
          iVar53 = 1;
          if (uVar25 != 0) {
            auVar38 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar39 = vmovdqa64_avx512f(auVar37);
            do {
              auVar40 = vmovdqa64_avx512f(auVar39);
              auVar39 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar14 = vpcmpuq_avx512f(auVar39,auVar38,2);
              bVar18 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar45,auVar38,2);
              bVar19 = (byte)uVar14;
              uVar32 = CONCAT11(bVar19,bVar18);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar9[uVar26].d.d + uVar27));
              auVar46._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar39._4_4_;
              auVar46._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
              auVar46._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar39._8_4_;
              auVar46._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar39._12_4_;
              auVar46._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar39._16_4_;
              auVar46._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar39._20_4_;
              auVar46._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar39._24_4_;
              auVar46._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar39._28_4_;
              auVar46._32_4_ = (uint)(bVar19 & 1) * auVar39._32_4_;
              auVar46._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar39._36_4_;
              auVar46._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar39._40_4_;
              auVar46._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar39._44_4_;
              auVar46._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar39._48_4_;
              auVar46._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar39._52_4_;
              auVar46._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar39._56_4_;
              auVar46._60_4_ = (uint)(bVar19 >> 7) * auVar39._60_4_;
              auVar39 = vpmulld_avx512f(auVar46,auVar40);
              uVar27 = uVar27 + 0x10;
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar27);
            auVar38 = vmovdqa32_avx512f(auVar39);
            auVar39._0_4_ =
                 (uint)(bVar18 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar40._0_4_;
            bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar39._4_4_ = (uint)bVar11 * auVar38._4_4_ | (uint)!bVar11 * auVar40._4_4_;
            bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar39._8_4_ = (uint)bVar11 * auVar38._8_4_ | (uint)!bVar11 * auVar40._8_4_;
            bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar39._12_4_ = (uint)bVar11 * auVar38._12_4_ | (uint)!bVar11 * auVar40._12_4_;
            bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar39._16_4_ = (uint)bVar11 * auVar38._16_4_ | (uint)!bVar11 * auVar40._16_4_;
            bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar39._20_4_ = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * auVar40._20_4_;
            bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar39._24_4_ = (uint)bVar11 * auVar38._24_4_ | (uint)!bVar11 * auVar40._24_4_;
            bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar39._28_4_ = (uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * auVar40._28_4_;
            auVar39._32_4_ =
                 (uint)(bVar19 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar40._32_4_;
            bVar11 = (bool)(bVar19 >> 1 & 1);
            auVar39._36_4_ = (uint)bVar11 * auVar38._36_4_ | (uint)!bVar11 * auVar40._36_4_;
            bVar11 = (bool)(bVar19 >> 2 & 1);
            auVar39._40_4_ = (uint)bVar11 * auVar38._40_4_ | (uint)!bVar11 * auVar40._40_4_;
            bVar11 = (bool)(bVar19 >> 3 & 1);
            auVar39._44_4_ = (uint)bVar11 * auVar38._44_4_ | (uint)!bVar11 * auVar40._44_4_;
            bVar11 = (bool)(bVar19 >> 4 & 1);
            auVar39._48_4_ = (uint)bVar11 * auVar38._48_4_ | (uint)!bVar11 * auVar40._48_4_;
            bVar11 = (bool)(bVar19 >> 5 & 1);
            auVar39._52_4_ = (uint)bVar11 * auVar38._52_4_ | (uint)!bVar11 * auVar40._52_4_;
            bVar11 = (bool)(bVar19 >> 6 & 1);
            auVar39._56_4_ = (uint)bVar11 * auVar38._56_4_ | (uint)!bVar11 * auVar40._56_4_;
            auVar39._60_4_ =
                 (uint)(bVar19 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar40._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar39,1);
            auVar38 = vpmulld_avx512f(auVar39,ZEXT3264(auVar34));
            auVar64 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar33 = vpshufd_avx(auVar64,0xee);
            auVar64 = vpmulld_avx(auVar64,auVar33);
            auVar33 = vpshufd_avx(auVar64,0x55);
            auVar64 = vpmulld_avx(auVar64,auVar33);
            iVar53 = auVar64._0_4_;
          }
          pTVar10 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar25 = (ulong)pTVar10[uVar26].d.nd;
          if (uVar25 != 0) {
            auVar38 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar39 = vmovdqa64_avx512f(auVar37);
            do {
              auVar40 = vmovdqa64_avx512f(auVar39);
              auVar39 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar14 = vpcmpuq_avx512f(auVar39,auVar38,2);
              bVar18 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar45,auVar38,2);
              bVar19 = (byte)uVar14;
              uVar32 = CONCAT11(bVar19,bVar18);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar10[uVar26].d.d + uVar27));
              auVar47._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar39._4_4_;
              auVar47._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
              auVar47._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar39._8_4_;
              auVar47._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar39._12_4_;
              auVar47._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar39._16_4_;
              auVar47._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar39._20_4_;
              auVar47._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar39._24_4_;
              auVar47._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar39._28_4_;
              auVar47._32_4_ = (uint)(bVar19 & 1) * auVar39._32_4_;
              auVar47._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar39._36_4_;
              auVar47._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar39._40_4_;
              auVar47._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar39._44_4_;
              auVar47._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar39._48_4_;
              auVar47._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar39._52_4_;
              auVar47._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar39._56_4_;
              auVar47._60_4_ = (uint)(bVar19 >> 7) * auVar39._60_4_;
              auVar39 = vpmulld_avx512f(auVar47,auVar40);
              uVar27 = uVar27 + 0x10;
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar27);
            auVar38 = vmovdqa32_avx512f(auVar39);
            auVar48._0_4_ =
                 (uint)(bVar18 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar40._0_4_;
            bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar11 * auVar38._4_4_ | (uint)!bVar11 * auVar40._4_4_;
            bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar11 * auVar38._8_4_ | (uint)!bVar11 * auVar40._8_4_;
            bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar48._12_4_ = (uint)bVar11 * auVar38._12_4_ | (uint)!bVar11 * auVar40._12_4_;
            bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar48._16_4_ = (uint)bVar11 * auVar38._16_4_ | (uint)!bVar11 * auVar40._16_4_;
            bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar48._20_4_ = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * auVar40._20_4_;
            bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar48._24_4_ = (uint)bVar11 * auVar38._24_4_ | (uint)!bVar11 * auVar40._24_4_;
            bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar48._28_4_ = (uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * auVar40._28_4_;
            auVar48._32_4_ =
                 (uint)(bVar19 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar40._32_4_;
            bVar11 = (bool)(bVar19 >> 1 & 1);
            auVar48._36_4_ = (uint)bVar11 * auVar38._36_4_ | (uint)!bVar11 * auVar40._36_4_;
            bVar11 = (bool)(bVar19 >> 2 & 1);
            auVar48._40_4_ = (uint)bVar11 * auVar38._40_4_ | (uint)!bVar11 * auVar40._40_4_;
            bVar11 = (bool)(bVar19 >> 3 & 1);
            auVar48._44_4_ = (uint)bVar11 * auVar38._44_4_ | (uint)!bVar11 * auVar40._44_4_;
            bVar11 = (bool)(bVar19 >> 4 & 1);
            auVar48._48_4_ = (uint)bVar11 * auVar38._48_4_ | (uint)!bVar11 * auVar40._48_4_;
            bVar11 = (bool)(bVar19 >> 5 & 1);
            auVar48._52_4_ = (uint)bVar11 * auVar38._52_4_ | (uint)!bVar11 * auVar40._52_4_;
            bVar11 = (bool)(bVar19 >> 6 & 1);
            auVar48._56_4_ = (uint)bVar11 * auVar38._56_4_ | (uint)!bVar11 * auVar40._56_4_;
            auVar48._60_4_ =
                 (uint)(bVar19 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar40._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar48,1);
            auVar38 = vpmulld_avx512f(auVar48,ZEXT3264(auVar34));
            auVar64 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar33 = vpshufd_avx(auVar64,0xee);
            auVar64 = vpmulld_avx(auVar64,auVar33);
            auVar33 = vpshufd_avx(auVar64,0x55);
            auVar64 = vpmulld_avx(auVar64,auVar33);
            iVar20 = auVar64._0_4_;
          }
          lVar4 = *(long *)local_98._0_8_;
          pfVar6 = pTVar9[uVar26].v;
          uVar31 = iVar53 * pTVar9[uVar26].d.bd;
          rVar1 = (pRVar30->super_Trainer).lambda;
          auVar64 = ZEXT416((uint)rVar1);
          local_70 = pTVar10[uVar26].v;
          uVar21 = iVar20 * pTVar10[uVar26].d.bd;
          local_68 = (ulong)uVar21;
          local_a8 = p_Var24;
          if (uVar21 == 0) {
            auVar55 = ZEXT816(0) << 0x40;
          }
          else {
            local_88 = ZEXT416((uint)rVar1);
            local_50.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl.
            super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            .
            super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
            .m_data = local_70;
            local_50.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl.
            super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
            .
            super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
            .m_outerStride.m_value = local_68;
            SVar54 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                               (&local_50,&local_c9,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                                 *)&local_70);
            auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar55._0_8_ = (double)SVar54;
            auVar55._8_8_ = extraout_XMM0_Qb_00;
            pRVar30 = local_c8;
            auVar64 = local_88;
          }
          auVar62._0_8_ = (double)(pRVar30->rho * *(float *)(lVar4 + uVar26 * 4));
          auVar62._8_8_ = 0;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = 1.0 - (double)pRVar30->rho;
          auVar33 = vfmadd213sd_fma(auVar58,auVar55,auVar62);
          *(float *)(lVar4 + uVar26 * 4) = (float)auVar33._0_8_;
          fVar12 = (float)auVar33._0_8_ + pRVar30->epsilon;
          auVar33 = vrsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
          auVar56 = vfmadd213ss_fma(ZEXT416((uint)(fVar12 * auVar33._0_4_)),auVar33,
                                    ZEXT416(0xc0400000));
          pTVar9 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pfVar7 = pTVar9[uVar26].v;
          uVar25 = (ulong)pTVar9[uVar26].d.nd;
          if (uVar25 == 0) {
            iVar20 = 1;
          }
          else {
            auVar38 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar39 = vmovdqa64_avx512f(auVar37);
            do {
              auVar40 = vmovdqa64_avx512f(auVar39);
              auVar39 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar14 = vpcmpuq_avx512f(auVar39,auVar38,2);
              bVar18 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar45,auVar38,2);
              bVar19 = (byte)uVar14;
              uVar32 = CONCAT11(bVar19,bVar18);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar9[uVar26].d.d + uVar27));
              auVar49._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar39._4_4_;
              auVar49._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
              auVar49._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar39._8_4_;
              auVar49._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar39._12_4_;
              auVar49._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar39._16_4_;
              auVar49._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar39._20_4_;
              auVar49._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar39._24_4_;
              auVar49._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar39._28_4_;
              auVar49._32_4_ = (uint)(bVar19 & 1) * auVar39._32_4_;
              auVar49._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar39._36_4_;
              auVar49._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar39._40_4_;
              auVar49._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar39._44_4_;
              auVar49._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar39._48_4_;
              auVar49._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar39._52_4_;
              auVar49._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar39._56_4_;
              auVar49._60_4_ = (uint)(bVar19 >> 7) * auVar39._60_4_;
              auVar39 = vpmulld_avx512f(auVar49,auVar40);
              uVar27 = uVar27 + 0x10;
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar27);
            auVar38 = vmovdqa32_avx512f(auVar39);
            auVar50._0_4_ =
                 (uint)(bVar18 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar40._0_4_;
            bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar11 * auVar38._4_4_ | (uint)!bVar11 * auVar40._4_4_;
            bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar11 * auVar38._8_4_ | (uint)!bVar11 * auVar40._8_4_;
            bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar50._12_4_ = (uint)bVar11 * auVar38._12_4_ | (uint)!bVar11 * auVar40._12_4_;
            bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar50._16_4_ = (uint)bVar11 * auVar38._16_4_ | (uint)!bVar11 * auVar40._16_4_;
            bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar50._20_4_ = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * auVar40._20_4_;
            bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar50._24_4_ = (uint)bVar11 * auVar38._24_4_ | (uint)!bVar11 * auVar40._24_4_;
            bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar50._28_4_ = (uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * auVar40._28_4_;
            auVar50._32_4_ =
                 (uint)(bVar19 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar40._32_4_;
            bVar11 = (bool)(bVar19 >> 1 & 1);
            auVar50._36_4_ = (uint)bVar11 * auVar38._36_4_ | (uint)!bVar11 * auVar40._36_4_;
            bVar11 = (bool)(bVar19 >> 2 & 1);
            auVar50._40_4_ = (uint)bVar11 * auVar38._40_4_ | (uint)!bVar11 * auVar40._40_4_;
            bVar11 = (bool)(bVar19 >> 3 & 1);
            auVar50._44_4_ = (uint)bVar11 * auVar38._44_4_ | (uint)!bVar11 * auVar40._44_4_;
            bVar11 = (bool)(bVar19 >> 4 & 1);
            auVar50._48_4_ = (uint)bVar11 * auVar38._48_4_ | (uint)!bVar11 * auVar40._48_4_;
            bVar11 = (bool)(bVar19 >> 5 & 1);
            auVar50._52_4_ = (uint)bVar11 * auVar38._52_4_ | (uint)!bVar11 * auVar40._52_4_;
            bVar11 = (bool)(bVar19 >> 6 & 1);
            auVar50._56_4_ = (uint)bVar11 * auVar38._56_4_ | (uint)!bVar11 * auVar40._56_4_;
            auVar50._60_4_ =
                 (uint)(bVar19 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar40._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar50,1);
            auVar38 = vpmulld_avx512f(auVar50,ZEXT3264(auVar34));
            auVar60 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar13 = vpshufd_avx(auVar60,0xee);
            auVar60 = vpmulld_avx(auVar60,auVar13);
            auVar13 = vpshufd_avx(auVar60,0x55);
            auVar60 = vpmulld_avx(auVar60,auVar13);
            iVar20 = auVar60._0_4_;
          }
          if (iVar20 * pTVar9[uVar26].d.bd != uVar31) goto LAB_0022dd1f;
          pTVar9 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar25 = (ulong)pTVar9[uVar26].d.nd;
          if (uVar25 == 0) {
            iVar20 = 1;
          }
          else {
            auVar38 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar39 = vmovdqa64_avx512f(auVar37);
            do {
              auVar40 = vmovdqa64_avx512f(auVar39);
              auVar39 = vpbroadcastq_avx512f();
              auVar45 = vporq_avx512f(auVar39,auVar35);
              auVar39 = vporq_avx512f(auVar39,auVar36);
              uVar14 = vpcmpuq_avx512f(auVar39,auVar38,2);
              bVar18 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar45,auVar38,2);
              bVar19 = (byte)uVar14;
              uVar32 = CONCAT11(bVar19,bVar18);
              auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar9[uVar26].d.d + uVar27));
              auVar51._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar39._4_4_;
              auVar51._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
              auVar51._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar39._8_4_;
              auVar51._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar39._12_4_;
              auVar51._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar39._16_4_;
              auVar51._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar39._20_4_;
              auVar51._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar39._24_4_;
              auVar51._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * auVar39._28_4_;
              auVar51._32_4_ = (uint)(bVar19 & 1) * auVar39._32_4_;
              auVar51._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar39._36_4_;
              auVar51._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar39._40_4_;
              auVar51._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar39._44_4_;
              auVar51._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar39._48_4_;
              auVar51._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar39._52_4_;
              auVar51._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar39._56_4_;
              auVar51._60_4_ = (uint)(bVar19 >> 7) * auVar39._60_4_;
              auVar39 = vpmulld_avx512f(auVar51,auVar40);
              uVar27 = uVar27 + 0x10;
            } while ((uVar25 + 0xf & 0x1fffffff0) != uVar27);
            auVar38 = vmovdqa32_avx512f(auVar39);
            auVar52._0_4_ =
                 (uint)(bVar18 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar40._0_4_;
            bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar11 * auVar38._4_4_ | (uint)!bVar11 * auVar40._4_4_;
            bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar11 * auVar38._8_4_ | (uint)!bVar11 * auVar40._8_4_;
            bVar11 = (bool)((byte)(uVar32 >> 3) & 1);
            auVar52._12_4_ = (uint)bVar11 * auVar38._12_4_ | (uint)!bVar11 * auVar40._12_4_;
            bVar11 = (bool)((byte)(uVar32 >> 4) & 1);
            auVar52._16_4_ = (uint)bVar11 * auVar38._16_4_ | (uint)!bVar11 * auVar40._16_4_;
            bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
            auVar52._20_4_ = (uint)bVar11 * auVar38._20_4_ | (uint)!bVar11 * auVar40._20_4_;
            bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
            auVar52._24_4_ = (uint)bVar11 * auVar38._24_4_ | (uint)!bVar11 * auVar40._24_4_;
            bVar11 = (bool)((byte)(uVar32 >> 7) & 1);
            auVar52._28_4_ = (uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * auVar40._28_4_;
            auVar52._32_4_ =
                 (uint)(bVar19 & 1) * auVar38._32_4_ | (uint)!(bool)(bVar19 & 1) * auVar40._32_4_;
            bVar11 = (bool)(bVar19 >> 1 & 1);
            auVar52._36_4_ = (uint)bVar11 * auVar38._36_4_ | (uint)!bVar11 * auVar40._36_4_;
            bVar11 = (bool)(bVar19 >> 2 & 1);
            auVar52._40_4_ = (uint)bVar11 * auVar38._40_4_ | (uint)!bVar11 * auVar40._40_4_;
            bVar11 = (bool)(bVar19 >> 3 & 1);
            auVar52._44_4_ = (uint)bVar11 * auVar38._44_4_ | (uint)!bVar11 * auVar40._44_4_;
            bVar11 = (bool)(bVar19 >> 4 & 1);
            auVar52._48_4_ = (uint)bVar11 * auVar38._48_4_ | (uint)!bVar11 * auVar40._48_4_;
            bVar11 = (bool)(bVar19 >> 5 & 1);
            auVar52._52_4_ = (uint)bVar11 * auVar38._52_4_ | (uint)!bVar11 * auVar40._52_4_;
            bVar11 = (bool)(bVar19 >> 6 & 1);
            auVar52._56_4_ = (uint)bVar11 * auVar38._56_4_ | (uint)!bVar11 * auVar40._56_4_;
            auVar52._60_4_ =
                 (uint)(bVar19 >> 7) * auVar38._60_4_ | (uint)!(bool)(bVar19 >> 7) * auVar40._60_4_;
            auVar34 = vextracti64x4_avx512f(auVar52,1);
            auVar38 = vpmulld_avx512f(auVar52,ZEXT3264(auVar34));
            auVar60 = vpmulld_avx(auVar38._0_16_,auVar38._16_16_);
            auVar13 = vpshufd_avx(auVar60,0xee);
            auVar60 = vpmulld_avx(auVar60,auVar13);
            auVar13 = vpshufd_avx(auVar60,0x55);
            auVar60 = vpmulld_avx(auVar60,auVar13);
            iVar20 = auVar60._0_4_;
          }
          uVar21 = iVar20 * pTVar9[uVar26].d.bd;
          uVar25 = (ulong)uVar21;
          if (uVar21 != uVar31) goto LAB_0022dcfd;
          pfVar8 = pTVar9[uVar26].v;
          uVar26 = uVar25;
          if ((((ulong)pfVar8 & 3) == 0) &&
             (uVar26 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 0xf), uVar25 <= uVar26))
          {
            uVar26 = uVar25;
          }
          fVar12 = local_a0._0_4_ * (pRVar30->super_Trainer).eta * auVar33._0_4_ * -0.5 *
                   auVar56._0_4_;
          uVar28 = uVar25 - uVar26;
          uVar27 = uVar28 + 0xf;
          if (-1 < (long)uVar28) {
            uVar27 = uVar28;
          }
          if (uVar26 != 0) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar33 = vxorps_avx512vl(ZEXT416((uint)fVar12),auVar16);
            uVar29 = 0;
            do {
              auVar56 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * pfVar6[uVar29])),auVar33,
                                        ZEXT416((uint)pfVar7[uVar29]));
              pfVar8[uVar29] = auVar56._0_4_ + pfVar8[uVar29];
              uVar29 = uVar29 + 1;
            } while (uVar26 != uVar29);
          }
          uVar27 = (uVar27 & 0xfffffffffffffff0) + uVar26;
          if (0xf < (long)uVar28) {
            auVar59._0_4_ = -fVar12;
            auVar59._4_4_ = 0x80000000;
            auVar59._8_4_ = 0x80000000;
            auVar59._12_4_ = 0x80000000;
            auVar38 = vbroadcastss_avx512f(auVar59);
            auVar63._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
            auVar63._8_4_ = auVar64._8_4_ ^ 0x80000000;
            auVar63._12_4_ = auVar64._12_4_ ^ 0x80000000;
            auVar39 = vbroadcastss_avx512f(auVar63);
            do {
              auVar40 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar26),auVar38,
                                            *(undefined1 (*) [64])(pfVar8 + uVar26));
              auVar40 = vfmadd231ps_avx512f(auVar40,auVar39,*(undefined1 (*) [64])(pfVar6 + uVar26))
              ;
              *(undefined1 (*) [64])(pfVar8 + uVar26) = auVar40;
              uVar26 = uVar26 + 0x10;
            } while ((long)uVar26 < (long)uVar27);
          }
          if ((long)uVar27 < (long)uVar25) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar33 = vxorps_avx512vl(ZEXT416((uint)fVar12),auVar17);
            do {
              auVar56 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * pfVar6[uVar27])),auVar33,
                                        ZEXT416((uint)pfVar7[uVar27]));
              pfVar8[uVar27] = auVar56._0_4_ + pfVar8[uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar25 != uVar27);
          }
          p_Var24 = local_a8->_M_nxt;
        } while (p_Var24 != (_Hash_node_base *)0x0);
      }
      local_c0 = (ulong)((int)local_c0 + 1);
      LookupParameters::clear(this_01);
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpbroadcastd_avx512f(ZEXT416(1));
      ppLVar23 = local_b0 + 1;
    } while (ppLVar23 != local_78);
  }
  (local_c8->super_Trainer).updates = (local_c8->super_Trainer).updates + 1.0;
  return;
}

Assistant:

void RmsPropTrainer::update(real scale) {
  unsigned pi = 0;
  if (!shadow_params_allocated) {
    hg.resize(model->parameters_list().size());

    pi = 0;
    hlg.resize(model->lookup_parameters_list().size());
    for (auto p : model->lookup_parameters_list()) {
      hlg[pi++].resize(p->size());
    }

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    real& d2 = hg[pi++];
    auto reg = p->values.vec() * lambda;
    real g2 = p->g.vec().squaredNorm();
    d2 = rho * d2 + (1.0 - rho) * g2;
    p->values.vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->g.vec() + reg);
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<real>& hlgx = hlg[pi++];
    for (auto i : p->non_zero_grads) {
      real& d2 = hlgx[i];
      auto reg = p->values[i].vec() * lambda;
      real g2 = p->grads[i].vec().squaredNorm();
      d2 = rho * d2 + (1.0 - rho) * g2;
      p->values[i].vec() -= ((eta * scale * gscale / sqrt(d2 + epsilon)) * p->grads[i].vec() + reg);
    }
    p->clear();
  }
  ++updates;
}